

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O2

HRESULT __thiscall
Js::JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments
          (StackFrame *this,LPCWSTR *outResult)

{
  FunctionBody *this_00;
  HRESULT HVar1;
  LPCWSTR functionName;
  ScriptContext *scriptContext;
  
  functionName = GetFunctionName(this);
  this_00 = (this->functionBody).ptr;
  if (this_00 != (FunctionBody *)0x0) {
    scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    HVar1 = StackTraceArguments::ToString(&this->argumentTypes,functionName,scriptContext,outResult)
    ;
    return HVar1;
  }
  *outResult = functionName;
  return 0;
}

Assistant:

HRESULT JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments(_In_ LPCWSTR *outResult) const
    {
        PCWSTR name = GetFunctionName();
        HRESULT hr = S_OK;
        if (IsScriptFunction())
        {
            hr = argumentTypes.ToString(name, functionBody->GetScriptContext(), outResult);
        }
        else
        {
            *outResult = name;
        }

        return hr;
    }